

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<40,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  int in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  uint32_t in_R8D;
  byte in_R9B;
  bool result;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  bool in_stack_0000007b;
  bool in_stack_0000007c;
  bool in_stack_0000007d;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000080;
  undefined2 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaa;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffab;
  undefined4 uVar5;
  undefined3 uVar6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x28,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12bc81);
  Blob<40>::Blob((Blob<40> *)&stack0xffffffffffffffd3);
  memset(&stack0xffffffffffffffd3,0,5);
  if ((local_d & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffffd0,
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    uVar5 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (void *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
               (uint32_t *)
               CONCAT44(uVar5,CONCAT13(in_stack_ffffffffffffffab,
                                       CONCAT12(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)
                                      )));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<40>,unsigned_int>
            ((pfHash)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0),(Blob<40> *)CONCAT44(in_ESI,in_EDX),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ECX,in_R8D));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  uVar6 = (undefined3)in_stack_ffffffffffffffc0;
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_00000080,in_stack_0000007f,in_stack_0000007e,in_stack_0000007d,
                     in_stack_0000007c,in_stack_0000007b);
  uVar5 = CONCAT13(bVar1 & bVar4,uVar6);
  printf("\n");
  bVar4 = (byte)((uint)uVar5 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,uVar5));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}